

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O3

ExprPtr __thiscall mathiu::impl::solve(impl *this,ExprPtr *ex,ExprPtr *var,ExprPtr *domain)

{
  _Rb_tree_header *p_Var1;
  _Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false> *idPat;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer ppVar5;
  long lVar6;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  *p_Var7;
  impl *piVar8;
  ExprPtr *pEVar9;
  ExprPtr *pEVar10;
  bool bVar11;
  enable_if_t<isTupleLikeV<const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
  eVar12;
  _Rb_tree_color _Var13;
  ostream *poVar14;
  variant_alternative_t<2UL,_variant<int,_Fraction,_Symbol,_Pi,_E,_I,_Infinity,_Sum,_Product,_Power,_Log,_Sin,_Arctan,_Set,_List,_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>,_PieceWise,_Pair,_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>,_True,_False,_Logical,_SetOp>_>
  *pvVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> _Var16;
  variant_alternative_t<1UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>_&>
  pIVar17;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  shared_ptr<const_mathiu::impl::Expr> *rhs;
  variant_alternative_t<2UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_00;
  variant_alternative_t<3UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_01;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar18;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar19;
  _Compatible_tree<mathiu::impl::ExprPtrLess> *__src;
  _Base_ptr p_Var20;
  variant_alternative_t<4UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_02;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>_&>
  pIVar21;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>_&>
  pPVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  _Atomic_word *p_Var24;
  _Atomic_word _Var25;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  IdProcess IVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  *p_Var27;
  size_t *psVar28;
  _Base_ptr p_Var29;
  _Rb_tree_header *p_Var30;
  pointer ex_03;
  undefined1 auVar31 [8];
  ExprPtr EVar32;
  Set solutionSet;
  Symbol var_;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE1;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_9f8;
  undefined1 local_9c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9c0;
  _Base_ptr local_9b8;
  _Base_ptr local_9b0;
  _Base_ptr p_Stack_9a8;
  size_t local_9a0;
  undefined1 local_998 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_990;
  _Base_ptr local_988;
  _Base_ptr local_980;
  _Base_ptr local_978;
  size_t local_970;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_968;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_938;
  undefined1 auStack_930 [16];
  undefined1 local_920 [72];
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_8d8;
  ulong uStack_8d0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_8c8;
  ulong uStack_8c0;
  undefined1 local_8b0;
  undefined1 local_8a0;
  undefined1 local_890;
  undefined1 local_880;
  long local_878;
  impl *local_870;
  long *local_868 [2];
  long local_858 [2];
  variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
  *local_848;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  impl local_838 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_830;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_828;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_820;
  long local_818;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_810;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_7c8;
  ulong uStack_7c0;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_7b8;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  *local_7a8;
  ExprPtr *local_7a0;
  ExprPtr *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  int local_778;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_770;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_760;
  impl *local_750;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_748;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_740;
  long local_738;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_730;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_6d8;
  ulong uStack_6d0;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_6c8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_6b8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_6b0;
  ExprPtr *local_6a8;
  ExprPtr *local_6a0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_698;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_690;
  undefined8 local_688;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_680;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_650;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_640;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  *local_630;
  ExprPtr *local_628;
  ExprPtr *local_620;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_618;
  undefined1 local_5f0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_5e8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_5c0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_598;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_590;
  undefined8 local_588;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_580;
  anon_class_1_0_00000001 *local_550;
  InternalPatternT<bool> IStack_548;
  undefined7 uStack_547;
  anon_class_1_0_00000001 *local_540;
  InternalPatternT<bool> IStack_538;
  undefined7 uStack_537;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_528;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_520;
  undefined8 local_518;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_510;
  RelationalKind local_4c0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_4b8;
  ulong uStack_4b0;
  anon_class_1_0_00000001 *local_4a8;
  InternalPatternT<bool> IStack_4a0;
  undefined7 uStack_49f;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_490;
  _Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_460;
  undefined1 local_420;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_418;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_410;
  undefined8 local_408;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_400;
  anon_class_1_0_00000001 *local_3d0;
  InternalPatternT<bool> IStack_3c8;
  undefined7 uStack_3c7;
  anon_class_1_0_00000001 *local_3c0;
  InternalPatternT<bool> IStack_3b8;
  undefined7 uStack_3b7;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_3a8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_3a0;
  undefined8 local_398;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_390;
  RelationalKind local_340;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_338;
  ulong uStack_330;
  anon_class_1_0_00000001 *local_328;
  InternalPatternT<bool> IStack_320;
  undefined7 uStack_31f;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_318;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_310;
  undefined8 local_308;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_300;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_2b8;
  ulong uStack_2b0;
  anon_class_1_0_00000001 *local_2a8;
  InternalPatternT<bool> IStack_2a0;
  undefined7 uStack_29f;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_290;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_238;
  undefined8 uStack_230;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_228;
  undefined4 local_1d8;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_1d0;
  ulong uStack_1c8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_1b8;
  undefined8 uStack_1b0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1a8;
  ulong local_178;
  undefined8 uStack_170;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_168;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> _Stack_160;
  undefined8 local_158;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_150;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_108;
  ulong uStack_100;
  anon_class_1_0_00000001 *local_f8;
  InternalPatternT<bool> IStack_f0;
  undefined7 uStack_ef;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_e0;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_98;
  undefined8 uStack_90;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_88;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_40;
  ulong uStack_38;
  
  local_870 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve: ",7);
  toString_abi_cxx11_((string *)&local_938,(impl *)ex,ex_00);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_938,auStack_930._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\t",2);
  toString_abi_cxx11_((string *)&local_748,(impl *)var,ex_01);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(char *)local_748,(long)_Stack_740);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,",\t",2);
  toString_abi_cxx11_((string *)&local_828,(impl *)domain,ex_02);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(char *)local_828,(long)_Stack_820);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  std::ostream::put((char)poVar14);
  std::ostream::flush();
  if (local_828 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )&local_818) {
    operator_delete((void *)local_828,local_818 + 1);
  }
  if (local_748 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )&local_738) {
    operator_delete((void *)local_748,local_738 + 1);
  }
  if (local_938 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )((long)auStack_930 + 8)) {
    operator_delete((void *)local_938,auStack_930._8_8_ + 1);
  }
  pvVar15 = std::
            get<2ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                      (&((var->
                         super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ExprVariant);
  local_868[0] = local_858;
  pcVar3 = (pvVar15->
           super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
           )._M_elems[0]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_868,pcVar3,
             pcVar3 + (pvVar15->
                      super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                      )._M_elems[0]._M_string_length);
  local_938._0_4_ = 0;
  auStack_930._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  auStack_930._8_8_ = 0;
  local_920._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  local_920._8_8_ = 0;
  local_920._16_8_ = 0;
  local_920._24_8_ = 0;
  local_920._32_8_ = 0;
  local_460._0_4_ = 0;
  local_460._M_first._M_storage._M_storage[0x38] = '\0';
  local_420 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                       *)auStack_930);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5c0);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5e8);
  local_938 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )((ulong)(uint)local_938._4_4_ << 0x20);
  auStack_930._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  auStack_930._8_8_ = 0;
  local_920._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  local_920._8_8_ = 0;
  local_618._0_4_ = 0;
  local_618._M_first._M_storage._M_storage[0x20] = '\0';
  local_5f0 = 0;
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                       *)auStack_930);
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_290,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5c0,
                (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_5e8);
  local_290.mPatterns.
  super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Head_base<0UL,_mathiu::impl::RelationalKind,_false>._M_head_impl = kEQUAL;
  matchit::impl::
  as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
              *)&local_238._M_first,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
             ,&local_290);
  local_938 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_930._0_8_ = local_238;
  auStack_930._8_8_ = uStack_230;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_920,&local_228);
  uStack_8d0 = CONCAT44(uStack_8d0._4_4_,local_1d8);
  local_8c8 = local_1d0;
  uStack_8c0 = uStack_1c8;
  local_528 = local_938;
  _Stack_520 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
               auStack_930._0_8_;
  local_518 = auStack_930._8_8_;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_510,
                (_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_920);
  local_4c0 = (RelationalKind)uStack_8d0;
  local_4b8 = local_8c8;
  uStack_4b0 = uStack_8c0;
  local_4a8 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_4a0 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)(local_920 + 0x28));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_920);
  local_3a8 = local_528;
  _Stack_3a0 = _Stack_520;
  local_398 = local_518;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_390,&local_510);
  local_340 = local_4c0;
  local_338 = local_4b8;
  uStack_330 = uStack_4b0;
  uStack_31f = uStack_49f;
  IStack_320 = IStack_4a0;
  local_328 = local_4a8;
  local_748 = local_3a8;
  _Stack_740 = _Stack_3a0;
  local_738 = local_398;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_730,&local_390);
  local_730.mPatterns.
  super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Head_base<0UL,_mathiu::impl::RelationalKind,_false>._M_head_impl = local_340;
  local_6d8 = local_338;
  uStack_6d0 = uStack_330;
  local_6c8.mUnary = local_328;
  local_6c8.mPattern = IStack_320;
  local_6c8._9_7_ = uStack_31f;
  local_6b8 = &local_5c0;
  local_6b0 = &local_5e8;
  local_6a8 = var;
  local_6a0 = domain;
  set<std::shared_ptr<mathiu::impl::Expr_const>const&>(local_838,var);
  local_790 = &matchit::impl::deref;
  local_788 = &matchit::impl::asPointer<int>;
  local_780 = &matchit::impl::deref;
  local_778 = 0;
  local_770.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_770.mPattern = true;
  local_760.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_760.mPattern = true;
  auStack_930._8_8_ = (_func_int **)0x0;
  local_938 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )0x0;
  auStack_930._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  local_920._16_8_ = 0;
  local_920._0_8_ = auStack_930;
  local_920._8_8_ = auStack_930;
  local_750 = local_838;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  _Var16 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)
           &this_00[1]._M_use_count;
  if ((_func_int **)auStack_930._8_8_ == (_func_int **)0x0) {
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var24 = &this_00[3]._M_use_count;
    _Var25 = 0;
    p_Var27 = (_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
               *)_Var16;
  }
  else {
    p_Var24 = (_Atomic_word *)(local_920 + 0x10);
    this_00[2]._vptr__Sp_counted_base = (_func_int **)auStack_930._8_8_;
    *(_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *)(auStack_930._8_8_ + 8) =
         _Var16;
    this_00[3]._M_use_count = local_920._16_4_;
    this_00[3]._M_weak_count = local_920._20_4_;
    auStack_930._8_8_ = (_func_int **)0x0;
    _Var16 = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)local_920._0_8_;
    p_Var27 = (_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
               *)local_920._8_8_;
    _Var25 = auStack_930._0_4_;
    local_920._0_8_ = auStack_930;
    local_920._8_8_ = auStack_930;
  }
  *(_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*> *)&this_00[2]._M_use_count =
       _Var16;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)p_Var27;
  *(undefined8 *)p_Var24 = 0;
  this_00[1]._M_use_count = _Var25;
  *(undefined1 *)&this_00[4]._M_use_count = 0xd;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)&local_938);
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_e0,(Id<mathiu::impl::Product> *)&local_460._M_first
            );
  matchit::impl::as<mathiu::impl::Product>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
              *)&local_98._M_first,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Product>,
             (Id<mathiu::impl::Product> *)&local_e0);
  local_938 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_930._0_8_ = local_98;
  auStack_930._8_8_ = uStack_90;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)local_920,(Id<mathiu::impl::Product> *)&local_88);
  local_8d8 = local_40;
  uStack_8d0 = uStack_38;
  local_318 = local_938;
  _Stack_310 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
               auStack_930._0_8_;
  local_308 = auStack_930._8_8_;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_300,(Id<mathiu::impl::Product> *)local_920);
  local_2b8 = local_8d8;
  uStack_2b0 = uStack_8d0;
  local_2a8 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_2a0 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_920);
  local_168 = local_318;
  _Stack_160 = _Stack_310;
  local_158 = local_308;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_150,(Id<mathiu::impl::Product> *)&local_300);
  local_108 = local_2b8;
  uStack_100 = uStack_2b0;
  uStack_ef = uStack_29f;
  IStack_f0 = IStack_2a0;
  local_f8 = local_2a8;
  local_828 = local_168;
  _Stack_820 = _Stack_160;
  local_818 = local_158;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_810,(Id<mathiu::impl::Product> *)&local_150);
  local_7c8 = local_108;
  uStack_7c0 = uStack_100;
  local_7b8.mUnary = local_f8;
  local_7b8.mPattern = IStack_f0;
  local_7b8._9_7_ = uStack_ef;
  local_7a8 = &local_460;
  local_7a0 = var;
  local_798 = domain;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_490,
             (Id<mathiu::impl::PieceWise> *)&local_618._M_first);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
              *)&local_1b8._M_first,
             (_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_490);
  local_938 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_930._0_8_ = local_1b8;
  auStack_930._8_8_ = uStack_1b0;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)local_920,(Id<mathiu::impl::PieceWise> *)&local_1a8);
  local_920._48_8_ = local_178;
  local_920._56_8_ = uStack_170;
  local_598 = local_938;
  _Stack_590 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
               auStack_930._0_8_;
  local_588 = auStack_930._8_8_;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_580,(Id<mathiu::impl::PieceWise> *)local_920);
  local_550 = (anon_class_1_0_00000001 *)local_920._48_8_;
  _IStack_548 = local_920._56_8_;
  local_540 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_538 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)local_920);
  local_418 = local_598;
  _Stack_410 = _Stack_590;
  local_408 = local_588;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_400,(Id<mathiu::impl::PieceWise> *)&local_580);
  local_3d0 = local_550;
  IStack_3c8 = IStack_548;
  uStack_3c7 = uStack_547;
  uStack_3b7 = uStack_537;
  IStack_3b8 = IStack_538;
  local_3c0 = local_540;
  local_698 = local_418;
  _Stack_690 = _Stack_410;
  local_688 = local_408;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_680,(Id<mathiu::impl::PieceWise> *)&local_400);
  local_650.mUnary = local_3d0;
  local_650.mPattern = IStack_3c8;
  local_650._9_7_ = uStack_3c7;
  local_640.mUnary = local_3c0;
  local_640.mPattern = IStack_3b8;
  local_640._9_7_ = uStack_3b7;
  local_630 = &local_618;
  local_628 = var;
  local_620 = domain;
  memset(&local_938,0,0xc0);
  auStack_930._0_8_ = auStack_930._0_8_ & 0xffffffffffffff00;
  local_920._0_8_ = local_920._0_8_ & 0xffffffffffffff00;
  local_920._16_8_ = local_920._16_8_ & 0xffffffffffffff00;
  local_920._32_8_ = local_920._32_8_ & 0xffffffffffffff00;
  local_920._48_8_ = local_920._48_8_ & 0xffffffffffffff00;
  local_920[0x40] = '\0';
  uStack_8d0 = uStack_8d0 & 0xffffffffffffff00;
  uStack_8c0 = uStack_8c0 & 0xffffffffffffff00;
  local_8b0 = 0;
  local_8a0 = 0;
  local_890 = 0;
  local_880 = 0;
  local_878 = 0;
  bVar11 = matchit::impl::
           PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
           ::
           matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                     (ex,&local_6c8,1,
                      (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                       *)&local_938);
  if (bVar11) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9f8._M_impl._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)p_Var4[3]._M_use_count == '\x0f') {
      local_9f8._M_impl._0_8_ = p_Var4;
    }
    std::
    variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
    ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                 *)(&local_938 + local_878 * 2),
                (tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 **)&local_9f8);
    lVar6 = local_878 * 2;
    local_878 = local_878 + 1;
    value = std::
            get<1ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                      ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                        *)(&local_938 + lVar6));
    bVar11 = matchit::impl::
             PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
             ::
             matchPatternImpl<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                       (value,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                               *)&local_6d8,4,
                        (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                         *)&local_938);
    if (bVar11) {
      eVar12 = matchit::impl::
               matchPattern<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const&,matchit::impl::Ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                         (*value,&local_730,5,
                          (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                           *)&local_938);
      IVar26 = (IdProcess)eVar12;
      matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
      processIdImpl(&local_730.mPatterns.
                     super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     ._M_head_impl,4,IVar26);
      matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
      processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_730,4,(uint)eVar12);
    }
    else {
      IVar26 = kCANCEL;
    }
    idPat = &local_730.mPatterns.
             super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             .
             super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             .
             super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
    ;
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,3,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_730,3,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,2,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_730,2,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,1,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_730,1,IVar26);
  }
  else {
    IVar26 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl(&local_730.mPatterns.
                 super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                 ._M_head_impl,0,IVar26);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_730,0,IVar26);
  if (IVar26 != kCANCEL) {
    pIVar17 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)local_998,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)local_6b8);
    lhs = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar17->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant.
                      super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
              + 0x10)]._M_data)
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                      *)local_998,
                     &(pIVar17->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant);
    pIVar17 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                          *)local_998,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)local_6b0);
    rhs = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar17->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant.
                      super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
              + 0x10)]._M_data)
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                      *)local_998,
                     &(pIVar17->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant);
    operator-((impl *)&local_968,lhs,rhs);
    expand((impl *)&local_9f8,(ExprPtr *)&local_968);
    solve((impl *)local_998,(ExprPtr *)&local_9f8,local_6a8,local_6a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_9f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                 local_9f8._M_impl.super__Rb_tree_header._M_header._M_color) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_9f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_9f8._M_impl.super__Rb_tree_header._M_header._M_color));
    }
    _Var23._M_pi = p_Stack_990;
    auVar31 = local_998;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_968._M_impl.super__Rb_tree_header._M_header._4_4_,
                 local_968._M_impl.super__Rb_tree_header._M_header._M_color) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_968._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_968._M_impl.super__Rb_tree_header._M_header._M_color));
      _Var23._M_pi = p_Stack_990;
      auVar31 = local_998;
    }
    goto LAB_001dd65d;
  }
  memset(&local_938,0,0xc0);
  auStack_930._0_8_ = auStack_930._0_8_ & 0xffffffffffffff00;
  local_920._0_8_ = local_920._0_8_ & 0xffffffffffffff00;
  local_920._16_8_ = local_920._16_8_ & 0xffffffffffffff00;
  local_920._32_8_ = local_920._32_8_ & 0xffffffffffffff00;
  local_920._48_8_ = local_920._48_8_ & 0xffffffffffffff00;
  local_920[0x40] = '\0';
  uStack_8d0 = uStack_8d0 & 0xffffffffffffff00;
  uStack_8c0 = uStack_8c0 & 0xffffffffffffff00;
  local_8b0 = 0;
  local_8a0 = 0;
  local_890 = 0;
  local_880 = 0;
  local_878 = 0;
  bVar11 = matchit::impl::
           PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
           ::
           matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                     (ex,&local_760,1,
                      (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                       *)&local_938);
  if (bVar11) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9f8._M_impl._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)p_Var4[3]._M_use_count == '\0') {
      local_9f8._M_impl._0_8_ = p_Var4;
    }
    std::
    variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
    ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                 *)(&local_938 + local_878 * 2),(int **)&local_9f8);
    lVar6 = local_878 * 2;
    local_878 = local_878 + 1;
    value_00 = std::
               get<2ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                         ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                           *)(&local_938 + lVar6));
    bVar11 = matchit::impl::
             PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
             ::
             matchPatternImpl<int_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                       (value_00,&local_770,4,
                        (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                         *)&local_938);
    if ((bVar11) && (local_778 == **value_00)) {
      auVar31 = *(undefined1 (*) [8])local_750;
      _Var23._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_750 + 8);
      if (_Var23._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var23._M_pi)->_M_use_count = (_Var23._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var23._M_pi)->_M_use_count = (_Var23._M_pi)->_M_use_count + 1;
        }
      }
      goto LAB_001dd65d;
    }
  }
  bVar11 = freeOf(ex,var);
  if (bVar11) {
    auVar31 = (undefined1  [8])(this_00 + 1);
    _Var23._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    goto LAB_001dd65d;
  }
  memset(&local_938,0,0xc0);
  auStack_930._0_8_ = auStack_930._0_8_ & 0xffffffffffffff00;
  local_920._0_8_ = local_920._0_8_ & 0xffffffffffffff00;
  local_920._16_8_ = local_920._16_8_ & 0xffffffffffffff00;
  local_920._32_8_ = local_920._32_8_ & 0xffffffffffffff00;
  local_920._48_8_ = local_920._48_8_ & 0xffffffffffffff00;
  local_920[0x40] = '\0';
  uStack_8d0 = uStack_8d0 & 0xffffffffffffff00;
  uStack_8c0 = uStack_8c0 & 0xffffffffffffff00;
  local_8b0 = 0;
  local_8a0 = 0;
  local_890 = 0;
  local_880 = 0;
  local_878 = 0;
  bVar11 = matchit::impl::
           PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
           ::
           matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                     (ex,&local_7b8,1,
                      (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                       *)&local_938);
  if (bVar11) {
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9f8._M_impl._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)p_Var4[3]._M_use_count == '\b') {
      local_9f8._M_impl._0_8_ = p_Var4;
    }
    std::
    variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
    ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                 *)(&local_938 + local_878 * 2),(Product **)&local_9f8);
    lVar6 = local_878 * 2;
    local_878 = local_878 + 1;
    value_01 = std::
               get<3ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                         ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                           *)(&local_938 + lVar6));
    bVar11 = matchit::impl::
             PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
             ::
             matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                       (value_01,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                  *)&local_7c8,4,
                        (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                         *)&local_938);
    if (bVar11) {
      bVar11 = matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
                         ((Id<mathiu::impl::Product> *)&local_810,*value_01);
      IVar26 = (IdProcess)bVar11;
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                ((Id<mathiu::impl::Product> *)&local_810,5,IVar26);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                ((Id<mathiu::impl::Product> *)&local_810,4,(uint)bVar11);
    }
    else {
      IVar26 = kCANCEL;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_810,3,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_810,2,IVar26);
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
              ((Id<mathiu::impl::Product> *)&local_810,1,IVar26);
  }
  else {
    IVar26 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
            ((Id<mathiu::impl::Product> *)&local_810,0,IVar26);
  if ((char)IVar26 == '\0') {
    memset(&local_938,0,0xc0);
    auStack_930._0_8_ = auStack_930._0_8_ & 0xffffffffffffff00;
    local_920._0_8_ = local_920._0_8_ & 0xffffffffffffff00;
    local_920._16_8_ = local_920._16_8_ & 0xffffffffffffff00;
    local_920._32_8_ = local_920._32_8_ & 0xffffffffffffff00;
    local_920._48_8_ = local_920._48_8_ & 0xffffffffffffff00;
    local_920[0x40] = '\0';
    uStack_8d0 = uStack_8d0 & 0xffffffffffffff00;
    uStack_8c0 = uStack_8c0 & 0xffffffffffffff00;
    local_8b0 = 0;
    local_8a0 = 0;
    local_890 = 0;
    local_880 = 0;
    local_878 = 0;
    bVar11 = matchit::impl::
             PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
             ::
             matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                       (ex,&local_640,1,
                        (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                         *)&local_938);
    if (bVar11) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_9f8._M_impl._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((char)p_Var4[3]._M_use_count == '\x10') {
        local_9f8._M_impl._0_8_ = p_Var4;
      }
      std::
      variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
      ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                   *)(&local_938 + local_878 * 2),(PieceWise **)&local_9f8);
      lVar6 = local_878 * 2;
      local_878 = local_878 + 1;
      value_02 = std::
                 get<4ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                           ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                             *)(&local_938 + lVar6));
      bVar11 = matchit::impl::
               PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
               ::
               matchPatternImpl<mathiu::impl::PieceWise_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                         (value_02,&local_650,4,
                          (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                           *)&local_938);
      if (bVar11) {
        bVar11 = matchit::impl::Id<mathiu::impl::PieceWise>::
                 matchValue<mathiu::impl::PieceWise_const&>
                           ((Id<mathiu::impl::PieceWise> *)&local_680,*value_02);
        IVar26 = (IdProcess)bVar11;
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                  ((Id<mathiu::impl::PieceWise> *)&local_680,5,IVar26);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                  ((Id<mathiu::impl::PieceWise> *)&local_680,4,(uint)bVar11);
      }
      else {
        IVar26 = kCANCEL;
      }
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                ((Id<mathiu::impl::PieceWise> *)&local_680,3,IVar26);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                ((Id<mathiu::impl::PieceWise> *)&local_680,2,IVar26);
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                ((Id<mathiu::impl::PieceWise> *)&local_680,1,IVar26);
    }
    else {
      IVar26 = kCANCEL;
    }
    matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
              ((Id<mathiu::impl::PieceWise> *)&local_680,0,IVar26);
    if ((char)IVar26 == '\0') {
      solvePoly((ExprPtr *)&local_938,ex);
      intersect((impl *)&local_9f8,(ExprPtr *)&local_938,domain);
      if ((_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)auStack_930._0_8_
          != (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_930._0_8_);
      }
      _Var23._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_9f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_9f8._M_impl.super__Rb_tree_header._M_header._M_color);
      auVar31 = (undefined1  [8])local_9f8._M_impl._0_8_;
    }
    else {
      pIVar21 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>&)_1_,matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_9f8,
                           (variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                            *)&local_630->_M_first);
      pPVar22 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const&)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_9f8,
                           &(pIVar21->super_IdBlockBase<mathiu::impl::PieceWise>).mVariant);
      ex_03 = (pPVar22->
              super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
              ).
              super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      pIVar21 = std::
                visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>&)_1_,matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                            *)&local_9f8,
                           (variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                            *)&local_630->_M_first);
      pPVar22 = std::
                visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const&)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>const&>
                          ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                            *)&local_9f8,
                           &(pIVar21->super_IdBlockBase<mathiu::impl::PieceWise>).mVariant);
      pEVar10 = local_620;
      pEVar9 = local_628;
      _Var23._M_pi = DAT_0026d688;
      auVar31 = (undefined1  [8])false_;
      ppVar5 = (pPVar22->
               super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ).
               super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_9c8 = (undefined1  [8])false_;
      _Stack_9c0._M_pi = DAT_0026d688;
      if (DAT_0026d688 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          DAT_0026d688->_M_use_count = DAT_0026d688->_M_use_count + 1;
          UNLOCK();
        }
        else {
          DAT_0026d688->_M_use_count = DAT_0026d688->_M_use_count + 1;
        }
      }
      if (ex_03 != ppVar5) {
        do {
          solveInequation((impl *)&local_968,&ex_03->second,pEVar9,pEVar10);
          solve((impl *)&local_9f8,&ex_03->first,pEVar9,(ExprPtr *)&local_968);
          union_((impl *)local_998,(ExprPtr *)local_9c8,(ExprPtr *)&local_9f8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_9f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                       local_9f8._M_impl.super__Rb_tree_header._M_header._M_color) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_9f8._M_impl.super__Rb_tree_header._M_header._4_4_,
                                local_9f8._M_impl.super__Rb_tree_header._M_header._M_color));
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_968._M_impl.super__Rb_tree_header._M_header._4_4_,
                       local_968._M_impl.super__Rb_tree_header._M_header._M_color) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_968._M_impl.super__Rb_tree_header._M_header._4_4_,
                                local_968._M_impl.super__Rb_tree_header._M_header._M_color));
          }
          p_Var4 = p_Stack_990;
          local_9c8 = local_998;
          _Var23._M_pi = _Stack_9c0._M_pi;
          local_998 = (undefined1  [8])0x0;
          p_Stack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Stack_9c0._M_pi = p_Var4;
          if ((_Var23._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var23._M_pi),
             p_Stack_990 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_990);
          }
          ex_03 = ex_03 + 1;
          _Var23._M_pi = _Stack_9c0._M_pi;
          auVar31 = local_9c8;
        } while (ex_03 != ppVar5);
      }
    }
    goto LAB_001dd65d;
  }
  pIVar18 = std::
            visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                        *)&local_9f8,
                       (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                        *)&local_7a8->_M_first);
  pPVar19 = std::
            visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                        *)&local_9f8,&(pIVar18->super_IdBlockBase<mathiu::impl::Product>).mVariant);
  p_Var20 = (pPVar19->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pIVar18 = std::
            visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
                        *)&local_9f8,
                       (variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                        *)&local_7a8->_M_first);
  pPVar19 = std::
            visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                      ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
                        *)&local_9f8,&(pIVar18->super_IdBlockBase<mathiu::impl::Product>).mVariant);
  pEVar10 = local_798;
  pEVar9 = local_7a0;
  p_Var30 = &(pPVar19->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
  local_9b0 = (_Base_ptr)&_Stack_9c0;
  local_9c8 = (undefined1  [8])0x0;
  _Stack_9c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9b8 = (_Base_ptr)0x0;
  local_9a0 = 0;
  p_Stack_9a8 = local_9b0;
  if ((_Rb_tree_header *)p_Var20 == p_Var30) {
LAB_001dd49a:
    local_980 = (_Base_ptr)&p_Stack_990;
    psVar28 = &local_970;
    local_988 = (_Base_ptr)0x0;
    _Var13 = _S_red;
    local_978 = local_980;
  }
  else {
    p_Var1 = &local_9f8._M_impl.super__Rb_tree_header;
    do {
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::_Rb_tree(&local_968,
                 (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                  *)local_9c8);
      solve((impl *)&local_848,(ExprPtr *)&p_Var20[1]._M_left,pEVar9,pEVar10);
      __src = (_Compatible_tree<mathiu::impl::ExprPtrLess> *)
              std::
              get<13ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                        (local_848);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::_M_merge_unique<mathiu::impl::ExprPtrLess>(&local_968,__src);
      if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
      }
      if (local_968._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        p_Var7 = &local_9f8;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      else {
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_968._M_impl.super__Rb_tree_header._M_header._M_parent;
        (local_968._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var1->_M_header;
        local_9f8._M_impl.super__Rb_tree_header._M_node_count =
             local_968._M_impl.super__Rb_tree_header._M_node_count;
        local_968._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        p_Var2 = &local_968._M_impl.super__Rb_tree_header;
        p_Var7 = &local_968;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_left =
             local_968._M_impl.super__Rb_tree_header._M_header._M_left;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_968._M_impl.super__Rb_tree_header._M_header._M_right;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_color =
             local_968._M_impl.super__Rb_tree_header._M_header._M_color;
        local_968._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_968._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      (p_Var7->_M_impl).super__Rb_tree_header._M_node_count = 0;
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::clear((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)local_9c8);
      if (local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        _Stack_9c0._M_pi._0_4_ = local_9f8._M_impl.super__Rb_tree_header._M_header._M_color;
        local_9b8 = local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_9b0 = local_9f8._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Stack_9a8 = local_9f8._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             (_Base_ptr)&_Stack_9c0;
        local_9a0 = local_9f8._M_impl.super__Rb_tree_header._M_node_count;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_9f8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_9f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::~_Rb_tree(&local_9f8);
      std::
      _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
      ::~_Rb_tree(&local_968);
      p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
    } while ((_Rb_tree_header *)p_Var20 != p_Var30);
    if (local_9b8 == (_Base_ptr)0x0) goto LAB_001dd49a;
    local_988 = local_9b8;
    local_9b8->_M_parent = (_Base_ptr)&p_Stack_990;
    local_970 = local_9a0;
    local_9b8 = (_Base_ptr)0x0;
    psVar28 = &local_9a0;
    local_980 = local_9b0;
    local_978 = p_Stack_9a8;
    _Var13 = (_Rb_tree_color)_Stack_9c0._M_pi;
    local_9b0 = (_Base_ptr)&_Stack_9c0;
    p_Stack_9a8 = (_Base_ptr)&_Stack_9c0;
  }
  *psVar28 = 0;
  p_Stack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(p_Stack_990._4_4_,_Var13);
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)local_9c8);
  _Var23._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (_Var23._M_pi)->_M_use_count = 1;
  (_Var23._M_pi)->_M_weak_count = 1;
  (_Var23._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  p_Var20 = (_Base_ptr)&_Var23._M_pi[1]._M_use_count;
  if (local_988 == (_Base_ptr)0x0) {
    _Var23._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var24 = &_Var23._M_pi[3]._M_use_count;
    _Var13 = _S_red;
    p_Var29 = p_Var20;
  }
  else {
    p_Var24 = (_Atomic_word *)&local_970;
    _Var23._M_pi[2]._vptr__Sp_counted_base = (_func_int **)local_988;
    local_988->_M_parent = p_Var20;
    _Var23._M_pi[3]._M_use_count = (undefined4)local_970;
    _Var23._M_pi[3]._M_weak_count = local_970._4_4_;
    local_988 = (_Base_ptr)0x0;
    p_Var20 = local_980;
    p_Var29 = local_978;
    _Var13 = (_Rb_tree_color)p_Stack_990;
    local_980 = (_Base_ptr)&p_Stack_990;
    local_978 = (_Base_ptr)&p_Stack_990;
  }
  *(_Base_ptr *)&_Var23._M_pi[2]._M_use_count = p_Var20;
  _Var23._M_pi[3]._vptr__Sp_counted_base = (_func_int **)p_Var29;
  *(undefined8 *)p_Var24 = 0;
  _Var23._M_pi[1]._M_use_count = _Var13;
  *(undefined1 *)&_Var23._M_pi[4]._M_use_count = 0xd;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)local_998);
  auVar31 = (undefined1  [8])(_Var23._M_pi + 1);
LAB_001dd65d:
  piVar8 = local_870;
  *(undefined1 (*) [8])local_870 = auVar31;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_870 + 8) = _Var23._M_pi;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_680);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_400);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_580);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1a8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_490);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_810);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_150);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_300);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_88);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_e0);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if (local_830 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_830);
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_730.mPatterns.
                          super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_730);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_390.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_390);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_510.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_510);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_228.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_228);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_290.mPatterns.
                          super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_290);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)&local_618._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_5e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_5c0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)&local_460._M_first);
  _Var23._M_pi = extraout_RDX;
  if (local_868[0] != local_858) {
    operator_delete(local_868[0],local_858[0] + 1);
    _Var23._M_pi = extraout_RDX_00;
  }
  EVar32.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var23._M_pi;
  EVar32.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar8;
  return (ExprPtr)EVar32.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr solve(ExprPtr const &ex, ExprPtr const &var, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "solve: " << toString(ex) << ",\t" << toString(var) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        auto const var_ = std::get<Symbol>(*var);
        using namespace matchit;
        const auto freeOfVar = meet([&](auto &&e)
                                    { return freeOf(e, var); });
        Id<Product> iP;
        Id<ExprPtr> iE1, iE2;
        Id<PieceWise> iPieceWise;
        return match(ex)(
            pattern | some(as<Relational>(ds(RelationalKind::kEQUAL, iE1, iE2))) = [&]
            { return solve(expand(*iE1 - *iE2), var, domain); },
            pattern | some(as<Integer>(0)) = expr(set(var)),
            pattern | freeOfVar = expr(set()),
            pattern | some(as<Product>(iP)) = [&]
            {
                auto solutionSet = std::accumulate((*iP).begin(), (*iP).end(), Set{}, [&](Set solutions, auto &&e)
                                                   {
                                                       solutions.merge(const_cast<Set &>(std::get<Set>(*solve(e.second, var, domain)))); // it is safe to const_cast a temp.
                                                       return solutions;
                                                   });
                return makeSharedExprPtr(std::move(solutionSet));
            },
            pattern | some(as<PieceWise>(iPieceWise)) = [&]
            { return std::accumulate((*iPieceWise).begin(), (*iPieceWise).end(), false_, [&](auto &&result, auto &&e)
                                     { return union_(result, solve(e.first, var, solveInequation(e.second, var, domain))); }); },
            // assume is poly
            pattern | _ = [&]
            {
                auto const sol = solvePoly(ex, var);
                return intersect(sol, domain);
            });
    }